

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_list2(lyd_node *parent,lys_module *module,char *name,char *keys,uint32_t options,
                    lyd_node **node)

{
  ly_ctx *plVar1;
  char *pcVar2;
  lysc_ext_instance *schema_00;
  char *name_00;
  lys_module *parent_00;
  uint32_t options_00;
  size_t sVar3;
  size_t name_len;
  uint uVar4;
  lysc_node *local_d0;
  ly_ctx *local_c8;
  ly_ctx *local_c0;
  ly_ctx *local_b8;
  ly_ctx *local_a8;
  ly_ctx *local_a0;
  ly_ctx *local_98;
  ly_ctx *local_90;
  ly_ctx *local_88;
  LY_ERR ret___1;
  ly_bool store_only;
  LY_ERR ret__;
  uint32_t getnext_opts;
  ly_ctx *ctx;
  lysc_ext_instance *ext;
  lysc_node *schema;
  lyd_node *ret;
  lyd_node **pplStack_48;
  LY_ERR r;
  lyd_node **node_local;
  char *pcStack_38;
  uint32_t options_local;
  char *keys_local;
  char *name_local;
  lys_module *module_local;
  lyd_node *parent_local;
  
  schema = (lysc_node *)0x0;
  ctx = (ly_ctx *)0x0;
  if (parent == (lyd_node *)0x0) {
    if (module == (lys_module *)0x0) {
      local_98 = (ly_ctx *)0x0;
    }
    else {
      local_98 = module->ctx;
    }
    local_90 = local_98;
  }
  else {
    if (parent->schema == (lysc_node *)0x0) {
      local_88 = (ly_ctx *)parent[2].schema;
    }
    else {
      local_88 = parent->schema->module->ctx;
    }
    local_90 = local_88;
  }
  options_00 = 0;
  if ((options & 1) != 0) {
    options_00 = 0x10;
  }
  pplStack_48 = node;
  node_local._4_4_ = options;
  pcStack_38 = keys;
  keys_local = name;
  name_local = (char *)module;
  module_local = (lys_module *)parent;
  if ((parent == (lyd_node *)0x0) && (module == (lys_module *)0x0)) {
    ly_log(local_90,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent || module",
           "lyd_new_list2");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if ((parent == (lyd_node *)0x0) && (node == (lyd_node **)0x0)) {
    ly_log(local_90,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent || node",
           "lyd_new_list2");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if (name == (char *)0x0) {
    ly_log(local_90,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name","lyd_new_list2");
    parent_local._4_4_ = LY_EINVAL;
  }
  else {
    if (parent != (lyd_node *)0x0) {
      if (parent->schema == (lysc_node *)0x0) {
        plVar1 = (ly_ctx *)parent[2].schema;
      }
      else {
        plVar1 = parent->schema->module->ctx;
      }
      if (((plVar1 != (ly_ctx *)0x0) && (module != (lys_module *)0x0)) &&
         (module->ctx != (ly_ctx *)0x0)) {
        if (parent == (lyd_node *)0x0) {
          local_a8 = (ly_ctx *)0x0;
        }
        else {
          if (parent->schema == (lysc_node *)0x0) {
            local_a0 = (ly_ctx *)parent[2].schema;
          }
          else {
            local_a0 = parent->schema->module->ctx;
          }
          local_a8 = local_a0;
        }
        if (module == (lys_module *)0x0) {
          local_b8 = (ly_ctx *)0x0;
        }
        else {
          local_b8 = module->ctx;
        }
        if (local_a8 != local_b8) {
          if (parent == (lyd_node *)0x0) {
            local_c8 = (ly_ctx *)0x0;
          }
          else {
            if (parent->schema == (lysc_node *)0x0) {
              local_c0 = (ly_ctx *)parent[2].schema;
            }
            else {
              local_c0 = parent->schema->module->ctx;
            }
            local_c8 = local_c0;
          }
          ly_log(local_c8,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
    if (module == (lys_module *)0x0) {
      name_local = (char *)parent->schema->module;
    }
    if (keys == (char *)0x0) {
      pcStack_38 = "";
    }
    if (parent == (lyd_node *)0x0) {
      local_d0 = (lysc_node *)0x0;
    }
    else {
      local_d0 = parent->schema;
    }
    ext = (lysc_ext_instance *)
          lys_find_child(local_d0,(lys_module *)name_local,name,0,0x10,options_00);
    parent_00 = module_local;
    if (((lysc_node *)ext == (lysc_node *)0x0) && (module_local != (lys_module *)0x0)) {
      pcVar2 = *(char **)(name_local + 8);
      sVar3 = strlen(*(char **)(name_local + 8));
      name_00 = keys_local;
      name_len = strlen(keys_local);
      ret._4_4_ = ly_nested_ext_schema
                            ((lyd_node *)parent_00,(lysc_node *)0x0,pcVar2,sVar3,LY_VALUE_JSON,
                             (void *)0x0,name_00,name_len,(lysc_node **)&ext,
                             (lysc_ext_instance **)&ctx);
      if ((ret._4_4_ != LY_SUCCESS) && (ret._4_4_ != LY_ENOT)) {
        return ret._4_4_;
      }
    }
    pcVar2 = pcStack_38;
    schema_00 = ext;
    if (ext == (lysc_ext_instance *)0x0) {
      ly_log(local_90,LY_LLERR,LY_EINVAL,"List node \"%s\" not found.",keys_local);
      parent_local._4_4_ = LY_ENOTFOUND;
    }
    else {
      if ((((ulong)ext->def & 0x2000000) == 0) || (*pcStack_38 != '\0')) {
        uVar4 = node_local._4_4_ & 2;
        sVar3 = strlen(pcStack_38);
        parent_local._4_4_ =
             lyd_create_list2((lysc_node *)schema_00,pcVar2,sVar3,uVar4 != 0,(lyd_node **)&schema);
      }
      else {
        parent_local._4_4_ = lyd_create_inner((lysc_node *)ext,(lyd_node **)&schema);
      }
      if (parent_local._4_4_ == LY_SUCCESS) {
        if (ctx != (ly_ctx *)0x0) {
          *(uint *)schema->hash = *(uint *)schema->hash | 8;
        }
        if (module_local != (lys_module *)0x0) {
          lyd_insert_node((lyd_node *)module_local,(lyd_node **)0x0,(lyd_node *)schema,0);
        }
        if (pplStack_48 != (lyd_node **)0x0) {
          *pplStack_48 = (lyd_node *)schema;
        }
        parent_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  return parent_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_list2(struct lyd_node *parent, const struct lys_module *module, const char *name, const char *keys,
        uint32_t options, struct lyd_node **node)
{
    LY_ERR r;
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct lysc_ext_instance *ext = NULL;
    const struct ly_ctx *ctx = parent ? LYD_CTX(parent) : (module ? module->ctx : NULL);
    uint32_t getnext_opts = (options & LYD_NEW_VAL_OUTPUT) ? LYS_GETNEXT_OUTPUT : 0;

    LY_CHECK_ARG_RET(ctx, parent || module, parent || node, name, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, module ? module->ctx : NULL, LY_EINVAL);

    if (!module) {
        module = parent->schema->module;
    }
    if (!keys) {
        keys = "";
    }

    /* find schema node */
    schema = lys_find_child(parent ? parent->schema : NULL, module, name, 0, LYS_LIST, getnext_opts);
    if (!schema && parent) {
        r = ly_nested_ext_schema(parent, NULL, module->name, strlen(module->name), LY_VALUE_JSON, NULL, name, strlen(name),
                &schema, &ext);
        LY_CHECK_RET(r && (r != LY_ENOT), r);
    }
    LY_CHECK_ERR_RET(!schema, LOGERR(ctx, LY_EINVAL, "List node \"%s\" not found.", name), LY_ENOTFOUND);

    if ((schema->flags & LYS_KEYLESS) && !keys[0]) {
        /* key-less list */
        LY_CHECK_RET(lyd_create_inner(schema, &ret));
    } else {
        /* create the list node */
        ly_bool store_only = (options & LYD_NEW_VAL_STORE_ONLY) ? 1 : 0;

        LY_CHECK_RET(lyd_create_list2(schema, keys, strlen(keys), store_only, &ret));
    }
    if (ext) {
        ret->flags |= LYD_EXT;
    }
    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_DEFAULT);
    }

    if (node) {
        *node = ret;
    }
    return LY_SUCCESS;
}